

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

int __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_16U,_0U>::Clamp
          (Integer<int,_16U,_0U> *this,int n)

{
  int __y;
  longdouble in_ST0;
  longdouble in_ST1;
  int local_4c;
  int local_48;
  int x;
  int max;
  int min;
  bool isUnsigned;
  int n_local;
  Integer<int,_16U,_0U> *this_local;
  
  __y = n;
  std::pow<long_double,int>((__type_conflict1 *)0xf,(longdouble)2.0,n);
  local_4c = (int)ROUND(-in_ST0);
  std::pow<long_double,int>((__type_conflict1 *)0xf,(longdouble)2.0,__y);
  local_48 = n;
  if ((int)ROUND(-(longdouble)1 + in_ST1) < n) {
    local_48 = (int)ROUND(-(longdouble)1 + in_ST1);
  }
  if (local_4c <= local_48) {
    local_4c = local_48;
  }
  return local_4c;
}

Assistant:

T Clamp(T n) const
		{
			const bool isUnsigned = (T(0) < T(-1));
			const T	min		  = T(isUnsigned ? 0.L : -pow(2.L, int(SIZE - 1)));
			const T	max		  = T(isUnsigned ? pow(2.L, int(SIZE)) - 1.L : pow(2.L, int(SIZE - 1)) - 1.L);
			const T	x		  = n > max ? max : n;
			return x < min ? min : x;
		}